

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O2

sexp sexp_destroy_context(sexp ctx)

{
  sexp_heap psVar1;
  sexp_conflict psVar2;
  sexp_heap_conflict heap;
  size_t sum_freed;
  
  heap = (ctx->value).context.heap;
  if (heap != (sexp_heap_conflict)0x0) {
    ctx->markedp = '\x01';
    ((ctx->value).type.setters)->markedp = '\x01';
    sexp_mark(ctx,(((ctx->value).type.setters)->value).type.getters);
    psVar2 = sexp_finalize(ctx);
    if (psVar2 == (sexp_conflict)&DAT_0000003e) {
      return (sexp)&DAT_0000003e;
    }
    sexp_sweep(ctx,&sum_freed);
    psVar2 = sexp_finalize(ctx);
    if (psVar2 == (sexp_conflict)&DAT_0000003e) {
      return (sexp)&DAT_0000003e;
    }
    (ctx->value).type.finalize = (sexp_proc2)0x0;
    while (heap != (sexp_heap_conflict)0x0) {
      psVar1 = heap->next;
      sexp_free_heap(heap);
      heap = psVar1;
    }
  }
  return (sexp)&DAT_0000013e;
}

Assistant:

sexp sexp_destroy_context (sexp ctx) {
  sexp_heap heap, tmp;
  size_t sum_freed;
  if (sexp_context_heap(ctx)) {
    heap = sexp_context_heap(ctx);
#if SEXP_USE_DEBUG_GC
    sexp_debug_heap_stats(heap);
#endif
#if SEXP_USE_TRACK_ALLOC_TIMES
    sexp_debug_alloc_times(ctx);
#endif
#if SEXP_USE_TRACK_ALLOC_SIZES
    sexp_debug_alloc_sizes(ctx);
#endif
    sexp_markedp(ctx) = 1;
    sexp_markedp(sexp_context_globals(ctx)) = 1;
    sexp_mark(ctx, sexp_global(ctx, SEXP_G_TYPES));
    if (sexp_finalize(ctx) == SEXP_FALSE) { return SEXP_FALSE; }
    sexp_sweep(ctx, &sum_freed);
    if (sexp_finalize(ctx) == SEXP_FALSE) { return SEXP_FALSE; }
    sexp_context_heap(ctx) = NULL;
    for ( ; heap; heap=tmp) {
      tmp = heap->next;
      sexp_free_heap(heap);
    }
  }
  return SEXP_TRUE;
}